

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCamera>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,GeomCamera *camera
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  bool bVar1;
  __type _Var2;
  Property *pPVar3;
  string *psVar4;
  Attribute *this;
  AttrMeta *pAVar5;
  AttrMeta *pAVar6;
  size_type sVar7;
  mapped_type *this_00;
  ostream *poVar8;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  undefined8 in_stack_ffffffffffffd908;
  undefined4 uVar10;
  TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *target;
  bool local_26c1;
  bool local_2699;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2590;
  ostringstream local_2570 [8];
  ostringstream ss_e_12;
  allocator local_23d1;
  value_type local_23d0 [4];
  function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::StereoRole,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_23b0;
  allocator local_2389;
  string local_2388;
  undefined1 local_2368 [8];
  function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::StereoRole,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun_1;
  Attribute *attr_2;
  allocator local_2329;
  value_type local_2328 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2308 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22e8 [32];
  ostringstream local_22c8 [8];
  ostringstream ss_w_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2150;
  string local_2130;
  allocator local_2109;
  key_type local_2108 [4];
  _Base_ptr local_20e8;
  undefined1 local_20e0;
  allocator local_20d1;
  value_type local_20d0 [4];
  function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::Projection,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_20b0;
  allocator local_2089;
  string local_2088;
  undefined1 local_2068 [8];
  function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::Projection,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  Attribute *attr_1;
  allocator local_2029;
  value_type local_2028 [4];
  Attribute *local_2008;
  Attribute *attr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1fe0 [32];
  ostringstream local_1fc0 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e48;
  string local_1e28;
  allocator local_1e01;
  key_type local_1e00 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1de0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1dc0 [39];
  allocator local_1d99;
  string local_1d98 [32];
  string local_1d78;
  ostringstream local_1d58 [8];
  ostringstream ss_e_11;
  allocator local_1bd9;
  string local_1bd8;
  string local_1bb8;
  undefined1 local_1b98 [8];
  ParseResult ret_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b50 [39];
  allocator local_1b29;
  string local_1b28 [32];
  string local_1b08;
  ostringstream local_1ae8 [8];
  ostringstream ss_e_10;
  allocator local_1969;
  string local_1968;
  string local_1948;
  undefined1 local_1928 [8];
  ParseResult ret_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18e0 [39];
  allocator local_18b9;
  string local_18b8 [32];
  string local_1898;
  ostringstream local_1878 [8];
  ostringstream ss_e_9;
  allocator local_16f9;
  undefined1 local_16f8 [32];
  undefined1 local_16d8 [40];
  ParseResult ret_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1670 [39];
  allocator local_1649;
  string local_1648 [32];
  string local_1628;
  ostringstream local_1608 [8];
  ostringstream ss_e_8;
  allocator local_1489;
  undefined1 local_1488 [32];
  undefined1 local_1468 [40];
  ParseResult ret_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1400 [39];
  allocator local_13d9;
  string local_13d8 [32];
  string local_13b8;
  ostringstream local_1398 [8];
  ostringstream ss_e_7;
  allocator local_1219;
  string local_1218;
  string local_11f8;
  undefined1 local_11d8 [8];
  ParseResult ret_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1190 [39];
  allocator local_1169;
  string local_1168 [32];
  string local_1148;
  ostringstream local_1128 [8];
  ostringstream ss_e_6;
  allocator local_fa9;
  string local_fa8;
  string local_f88;
  undefined1 local_f68 [8];
  ParseResult ret_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f20 [39];
  allocator local_ef9;
  string local_ef8 [32];
  string local_ed8;
  ostringstream local_eb8 [8];
  ostringstream ss_e_5;
  allocator local_d39;
  string local_d38;
  string local_d18;
  undefined1 local_cf8 [8];
  ParseResult ret_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb0 [39];
  allocator local_c89;
  string local_c88 [32];
  string local_c68;
  ostringstream local_c48 [8];
  ostringstream ss_e_4;
  allocator local_ac9;
  string local_ac8;
  string local_aa8;
  undefined1 local_a88 [8];
  ParseResult ret_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40 [39];
  allocator local_a19;
  string local_a18 [32];
  string local_9f8;
  ostringstream local_9d8 [8];
  ostringstream ss_e_3;
  allocator local_859;
  string local_858;
  string local_838;
  undefined1 local_818 [8];
  ParseResult ret_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0 [39];
  allocator local_7a9;
  string local_7a8 [32];
  string local_788;
  ostringstream local_768 [8];
  ostringstream ss_e_2;
  allocator local_5e9;
  string local_5e8;
  string local_5c8;
  undefined1 local_5a8 [8];
  ParseResult ret_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560 [39];
  allocator local_539;
  string local_538 [32];
  string local_518;
  ostringstream local_4f8 [8];
  ostringstream ss_e_1;
  allocator local_379;
  string local_378;
  string local_358;
  undefined1 local_338 [8];
  ParseResult ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [32];
  string local_2a8;
  ostringstream local_288 [8];
  ostringstream ss_e;
  allocator local_109;
  string local_108;
  string local_e8;
  undefined1 local_c8 [8];
  ParseResult ret;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  undefined1 local_78 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  anon_class_1_0_00000001 StereoRoleHandler;
  anon_class_1_0_00000001 ProjectionHandler;
  string *err_local;
  string *warn_local;
  GeomCamera *camera_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  uVar10 = (undefined4)((ulong)in_stack_ffffffffffffd908 >> 0x20);
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_78);
  bVar1 = (bool)(options->strict_allowedToken_check & 1);
  target = (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
           CONCAT44(uVar10,(uint)bVar1);
  bVar1 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_78,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,&camera->super_GPrim,warn,err,bVar1);
  if (bVar1) {
    __end2 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::begin(properties);
    prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
            *)::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::end(properties);
    while (bVar1 = ::std::operator!=(&__end2,(_Self *)&prop), bVar1) {
      ret.err.field_2._8_8_ =
           ::std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
           ::operator*(&__end2);
      ::std::__cxx11::string::string((string *)&local_e8,(string *)ret.err.field_2._8_8_);
      pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_108,"focalLength",&local_109);
      psVar4 = &local_108;
      anon_unknown_0::ParseTypedAttribute<float>
                ((ParseResult *)local_c8,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_78,&local_e8,pPVar3,psVar4,&camera->focalLength);
      ::std::__cxx11::string::~string((string *)&local_108);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_109);
      ::std::__cxx11::string::~string((string *)&local_e8);
      if ((local_c8._0_4_ == Success) || (local_c8._0_4_ == AlreadyProcessed)) {
        __range2._4_4_ = 3;
      }
      else if (local_c8._0_4_ == Unmatched) {
        __range2._4_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_288);
        poVar8 = ::std::operator<<((ostream *)local_288,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"ReconstructPrim");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xeee);
        ::std::operator<<(poVar8," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_2c8,"Parsing attribute `{}` failed. Error: {}",&local_2c9);
        fmt::format<char[12],std::__cxx11::string>
                  (&local_2a8,(fmt *)local_2c8,(string *)"focalLength",(char (*) [12])&ret,psVar4);
        poVar8 = ::std::operator<<((ostream *)local_288,(string *)&local_2a8);
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::string::~string((string *)&local_2a8);
        ::std::__cxx11::string::~string(local_2c8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_2f0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_1.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=((string *)err,(string *)local_2f0);
          ::std::__cxx11::string::~string((string *)local_2f0);
          ::std::__cxx11::string::~string((string *)(ret_1.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        __range2._4_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_288);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_c8);
      if (__range2._4_4_ == 0) {
        ::std::__cxx11::string::string((string *)&local_358,(string *)ret.err.field_2._8_8_);
        pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_378,"focusDistance",&local_379);
        psVar4 = &local_378;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_338,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78,&local_358,pPVar3,psVar4,&camera->focusDistance);
        ::std::__cxx11::string::~string((string *)&local_378);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_379);
        ::std::__cxx11::string::~string((string *)&local_358);
        if ((local_338._0_4_ == Success) || (local_338._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_338._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_4f8);
          poVar8 = ::std::operator<<((ostream *)local_4f8,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrim");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xef0);
          ::std::operator<<(poVar8," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_538,"Parsing attribute `{}` failed. Error: {}",&local_539);
          fmt::format<char[14],std::__cxx11::string>
                    (&local_518,(fmt *)local_538,(string *)"focusDistance",(char (*) [14])&ret_1,
                     psVar4);
          poVar8 = ::std::operator<<((ostream *)local_4f8,(string *)&local_518);
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::string::~string((string *)&local_518);
          ::std::__cxx11::string::~string(local_538);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_539);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_560,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_2.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_560);
            ::std::__cxx11::string::~string((string *)local_560);
            ::std::__cxx11::string::~string((string *)(ret_2.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_4f8);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_338);
        if (__range2._4_4_ != 0) goto joined_r0x002adbe1;
        ::std::__cxx11::string::string((string *)&local_5c8,(string *)ret.err.field_2._8_8_);
        pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_5e8,"exposure",&local_5e9);
        psVar4 = &local_5e8;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_5a8,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78,&local_5c8,pPVar3,psVar4,&camera->exposure);
        ::std::__cxx11::string::~string((string *)&local_5e8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
        ::std::__cxx11::string::~string((string *)&local_5c8);
        if ((local_5a8._0_4_ == Success) || (local_5a8._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_5a8._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_768);
          poVar8 = ::std::operator<<((ostream *)local_768,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrim");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xef1);
          ::std::operator<<(poVar8," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_7a8,"Parsing attribute `{}` failed. Error: {}",&local_7a9);
          fmt::format<char[9],std::__cxx11::string>
                    (&local_788,(fmt *)local_7a8,(string *)0x5a0f8c,(char (*) [9])&ret_2,psVar4);
          poVar8 = ::std::operator<<((ostream *)local_768,(string *)&local_788);
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::string::~string((string *)&local_788);
          ::std::__cxx11::string::~string(local_7a8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_7d0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_3.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_7d0);
            ::std::__cxx11::string::~string((string *)local_7d0);
            ::std::__cxx11::string::~string((string *)(ret_3.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_768);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_5a8);
        if (__range2._4_4_ != 0) goto joined_r0x002adbe1;
        ::std::__cxx11::string::string((string *)&local_838,(string *)ret.err.field_2._8_8_);
        pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_858,"fStop",&local_859);
        psVar4 = &local_858;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_818,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78,&local_838,pPVar3,psVar4,&camera->fStop);
        ::std::__cxx11::string::~string((string *)&local_858);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_859);
        ::std::__cxx11::string::~string((string *)&local_838);
        if ((local_818._0_4_ == Success) || (local_818._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_818._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_9d8);
          poVar8 = ::std::operator<<((ostream *)local_9d8,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrim");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xef2);
          ::std::operator<<(poVar8," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_a18,"Parsing attribute `{}` failed. Error: {}",&local_a19);
          fmt::format<char[6],std::__cxx11::string>
                    (&local_9f8,(fmt *)local_a18,(string *)"fStop",(char (*) [6])&ret_3,psVar4);
          poVar8 = ::std::operator<<((ostream *)local_9d8,(string *)&local_9f8);
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::string::~string((string *)&local_9f8);
          ::std::__cxx11::string::~string(local_a18);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_a19);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_a40,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_4.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_a40);
            ::std::__cxx11::string::~string((string *)local_a40);
            ::std::__cxx11::string::~string((string *)(ret_4.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_9d8);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_818);
        if (__range2._4_4_ != 0) goto joined_r0x002adbe1;
        ::std::__cxx11::string::string((string *)&local_aa8,(string *)ret.err.field_2._8_8_);
        pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_ac8,"horizontalAperture",&local_ac9);
        psVar4 = &local_ac8;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_a88,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78,&local_aa8,pPVar3,psVar4,&camera->horizontalAperture);
        ::std::__cxx11::string::~string((string *)&local_ac8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
        ::std::__cxx11::string::~string((string *)&local_aa8);
        if ((local_a88._0_4_ == Success) || (local_a88._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_a88._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_c48);
          poVar8 = ::std::operator<<((ostream *)local_c48,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrim");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xef4);
          ::std::operator<<(poVar8," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_c88,"Parsing attribute `{}` failed. Error: {}",&local_c89);
          fmt::format<char[19],std::__cxx11::string>
                    (&local_c68,(fmt *)local_c88,(string *)"horizontalAperture",
                     (char (*) [19])&ret_4,psVar4);
          poVar8 = ::std::operator<<((ostream *)local_c48,(string *)&local_c68);
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::string::~string((string *)&local_c68);
          ::std::__cxx11::string::~string(local_c88);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_c89);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_cb0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_5.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_cb0);
            ::std::__cxx11::string::~string((string *)local_cb0);
            ::std::__cxx11::string::~string((string *)(ret_5.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_c48);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_a88);
        if (__range2._4_4_ != 0) goto joined_r0x002adbe1;
        ::std::__cxx11::string::string((string *)&local_d18,(string *)ret.err.field_2._8_8_);
        pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_d38,"horizontalApertureOffset",&local_d39);
        psVar4 = &local_d38;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_cf8,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78,&local_d18,pPVar3,psVar4,&camera->horizontalApertureOffset);
        ::std::__cxx11::string::~string((string *)&local_d38);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_d39);
        ::std::__cxx11::string::~string((string *)&local_d18);
        if ((local_cf8._0_4_ == Success) || (local_cf8._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_cf8._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_eb8);
          poVar8 = ::std::operator<<((ostream *)local_eb8,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrim");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xef6);
          ::std::operator<<(poVar8," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_ef8,"Parsing attribute `{}` failed. Error: {}",&local_ef9);
          fmt::format<char[25],std::__cxx11::string>
                    (&local_ed8,(fmt *)local_ef8,(string *)"horizontalApertureOffset",
                     (char (*) [25])&ret_5,psVar4);
          poVar8 = ::std::operator<<((ostream *)local_eb8,(string *)&local_ed8);
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::string::~string((string *)&local_ed8);
          ::std::__cxx11::string::~string(local_ef8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_ef9);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_f20,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_6.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_f20);
            ::std::__cxx11::string::~string((string *)local_f20);
            ::std::__cxx11::string::~string((string *)(ret_6.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_eb8);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_cf8);
        if (__range2._4_4_ != 0) goto joined_r0x002adbe1;
        ::std::__cxx11::string::string((string *)&local_f88,(string *)ret.err.field_2._8_8_);
        pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_fa8,"verticalAperture",&local_fa9);
        psVar4 = &local_fa8;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_f68,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78,&local_f88,pPVar3,psVar4,&camera->verticalAperture);
        ::std::__cxx11::string::~string((string *)&local_fa8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_fa9);
        ::std::__cxx11::string::~string((string *)&local_f88);
        if ((local_f68._0_4_ == Success) || (local_f68._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_f68._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1128);
          poVar8 = ::std::operator<<((ostream *)local_1128,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrim");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xef8);
          ::std::operator<<(poVar8," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_1168,"Parsing attribute `{}` failed. Error: {}",&local_1169);
          fmt::format<char[17],std::__cxx11::string>
                    (&local_1148,(fmt *)local_1168,(string *)"verticalAperture",
                     (char (*) [17])&ret_6,psVar4);
          poVar8 = ::std::operator<<((ostream *)local_1128,(string *)&local_1148);
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::string::~string((string *)&local_1148);
          ::std::__cxx11::string::~string(local_1168);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1169);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_1190,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_7.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_1190);
            ::std::__cxx11::string::~string((string *)local_1190);
            ::std::__cxx11::string::~string((string *)(ret_7.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_1128);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_f68);
        if (__range2._4_4_ != 0) goto joined_r0x002adbe1;
        ::std::__cxx11::string::string((string *)&local_11f8,(string *)ret.err.field_2._8_8_);
        pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_1218,"verticalApertureOffset",&local_1219);
        psVar4 = &local_1218;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_11d8,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78,&local_11f8,pPVar3,psVar4,&camera->verticalApertureOffset);
        ::std::__cxx11::string::~string((string *)&local_1218);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1219);
        ::std::__cxx11::string::~string((string *)&local_11f8);
        if ((local_11d8._0_4_ == DefineOnly) || (local_11d8._0_4_ == PathVector)) {
          __range2._4_4_ = 3;
        }
        else if (local_11d8._0_4_ == Path) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1398);
          poVar8 = ::std::operator<<((ostream *)local_1398,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrim");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xefa);
          ::std::operator<<(poVar8," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_13d8,"Parsing attribute `{}` failed. Error: {}",&local_13d9);
          fmt::format<char[23],std::__cxx11::string>
                    (&local_13b8,(fmt *)local_13d8,(string *)"verticalApertureOffset",
                     (char (*) [23])&ret_7,psVar4);
          poVar8 = ::std::operator<<((ostream *)local_1398,(string *)&local_13b8);
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::string::~string((string *)&local_13b8);
          ::std::__cxx11::string::~string(local_13d8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_13d9);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_1400,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_8.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_1400);
            ::std::__cxx11::string::~string((string *)local_1400);
            ::std::__cxx11::string::~string((string *)(ret_8.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_1398);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_11d8);
        if (__range2._4_4_ != 0) goto joined_r0x002adbe1;
        ::std::__cxx11::string::string((string *)local_1468,(string *)ret.err.field_2._8_8_);
        psVar4 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_1488,"clippingRange",&local_1489);
        pPVar3 = (Property *)local_1488;
        (anonymous_namespace)::ParseTypedAttribute<std::array<float,2ul>>
                  ((ParseResult *)(local_1468 + 0x20),(_anonymous_namespace_ *)local_78,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1468,psVar4,pPVar3,(string *)&camera->clippingRange,target);
        ::std::__cxx11::string::~string((string *)local_1488);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1489);
        ::std::__cxx11::string::~string((string *)local_1468);
        if ((local_1468._32_4_ == 0) || (local_1468._32_4_ == 2)) {
          __range2._4_4_ = 3;
        }
        else if (local_1468._32_4_ == 1) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1608);
          poVar8 = ::std::operator<<((ostream *)local_1608,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrim");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xefc);
          ::std::operator<<(poVar8," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_1648,"Parsing attribute `{}` failed. Error: {}",&local_1649);
          fmt::format<char[14],std::__cxx11::string>
                    (&local_1628,(fmt *)local_1648,(string *)"clippingRange",(char (*) [14])&ret_8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar3);
          poVar8 = ::std::operator<<((ostream *)local_1608,(string *)&local_1628);
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::string::~string((string *)&local_1628);
          ::std::__cxx11::string::~string(local_1648);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1649);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_1670,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_9.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_1670);
            ::std::__cxx11::string::~string((string *)local_1670);
            ::std::__cxx11::string::~string((string *)(ret_9.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_1608);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_1468 + 0x20));
        if (__range2._4_4_ != 0) goto joined_r0x002adbe1;
        ::std::__cxx11::string::string((string *)local_16d8,(string *)ret.err.field_2._8_8_);
        psVar4 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_16f8,"clippingPlanes",&local_16f9);
        pPVar3 = (Property *)local_16f8;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                  ((ParseResult *)(local_16d8 + 0x20),(_anonymous_namespace_ *)local_78,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_16d8,psVar4,pPVar3,(string *)&camera->clippingPlanes,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                    *)target);
        ::std::__cxx11::string::~string((string *)local_16f8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_16f9);
        ::std::__cxx11::string::~string((string *)local_16d8);
        if ((local_16d8._32_4_ == 0) || (local_16d8._32_4_ == 2)) {
          __range2._4_4_ = 3;
        }
        else if (local_16d8._32_4_ == 1) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1878);
          poVar8 = ::std::operator<<((ostream *)local_1878,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrim");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xefe);
          ::std::operator<<(poVar8," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_18b8,"Parsing attribute `{}` failed. Error: {}",&local_18b9);
          fmt::format<char[15],std::__cxx11::string>
                    (&local_1898,(fmt *)local_18b8,(string *)"clippingPlanes",(char (*) [15])&ret_9,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar3);
          poVar8 = ::std::operator<<((ostream *)local_1878,(string *)&local_1898);
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::string::~string((string *)&local_1898);
          ::std::__cxx11::string::~string(local_18b8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_18b9);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_18e0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_10.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_18e0);
            ::std::__cxx11::string::~string((string *)local_18e0);
            ::std::__cxx11::string::~string((string *)(ret_10.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_1878);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_16d8 + 0x20));
        if (__range2._4_4_ != 0) goto joined_r0x002adbe1;
        ::std::__cxx11::string::string((string *)&local_1948,(string *)ret.err.field_2._8_8_);
        pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_1968,"shutter:open",&local_1969);
        psVar4 = &local_1968;
        anon_unknown_0::ParseTypedAttribute<double>
                  ((ParseResult *)local_1928,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78,&local_1948,pPVar3,psVar4,&camera->shutterOpen);
        ::std::__cxx11::string::~string((string *)&local_1968);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1969);
        ::std::__cxx11::string::~string((string *)&local_1948);
        if ((local_1928._0_4_ == Success) || (local_1928._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_1928._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1ae8);
          poVar8 = ::std::operator<<((ostream *)local_1ae8,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrim");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xeff);
          ::std::operator<<(poVar8," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_1b28,"Parsing attribute `{}` failed. Error: {}",&local_1b29);
          fmt::format<char[13],std::__cxx11::string>
                    (&local_1b08,(fmt *)local_1b28,(string *)"shutter:open",(char (*) [13])&ret_10,
                     psVar4);
          poVar8 = ::std::operator<<((ostream *)local_1ae8,(string *)&local_1b08);
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::string::~string((string *)&local_1b08);
          ::std::__cxx11::string::~string(local_1b28);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1b29);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_1b50,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_11.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_1b50);
            ::std::__cxx11::string::~string((string *)local_1b50);
            ::std::__cxx11::string::~string((string *)(ret_11.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_1ae8);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_1928);
        if (__range2._4_4_ != 0) goto joined_r0x002adbe1;
        ::std::__cxx11::string::string((string *)&local_1bb8,(string *)ret.err.field_2._8_8_);
        pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_1bd8,"shutter:close",&local_1bd9);
        psVar4 = &local_1bd8;
        anon_unknown_0::ParseTypedAttribute<double>
                  ((ParseResult *)local_1b98,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78,&local_1bb8,pPVar3,psVar4,&camera->shutterClose);
        ::std::__cxx11::string::~string((string *)&local_1bd8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1bd9);
        ::std::__cxx11::string::~string((string *)&local_1bb8);
        if ((local_1b98._0_4_ == Success) || (local_1b98._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_1b98._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1d58);
          poVar8 = ::std::operator<<((ostream *)local_1d58,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrim");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xf01);
          ::std::operator<<(poVar8," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_1d98,"Parsing attribute `{}` failed. Error: {}",&local_1d99);
          fmt::format<char[14],std::__cxx11::string>
                    (&local_1d78,(fmt *)local_1d98,(string *)"shutter:close",(char (*) [14])&ret_11,
                     psVar4);
          poVar8 = ::std::operator<<((ostream *)local_1d58,(string *)&local_1d78);
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::string::~string((string *)&local_1d78);
          ::std::__cxx11::string::~string(local_1d98);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1d99);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_1dc0,local_1de0);
            ::std::__cxx11::string::operator=((string *)err,(string *)local_1dc0);
            ::std::__cxx11::string::~string((string *)local_1dc0);
            ::std::__cxx11::string::~string((string *)local_1de0);
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_1d58);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_1b98);
        if (__range2._4_4_ != 0) goto joined_r0x002adbe1;
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)ret.err.field_2._8_8_,"projection");
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)local_1e00,"projection",&local_1e01);
          sVar7 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_78,local_1e00);
          ::std::__cxx11::string::~string((string *)local_1e00);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1e01);
          if (sVar7 == 0) {
            Property::value_type_name_abi_cxx11_
                      (&local_1e28,(Property *)(ret.err.field_2._8_8_ + 0x20));
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var2 = ::std::operator==(&local_1e28,&local_1e48);
            local_2699 = false;
            if (_Var2) {
              bVar1 = Property::is_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
              local_2699 = false;
              if (bVar1) {
                local_2699 = Property::is_empty((Property *)(ret.err.field_2._8_8_ + 0x20));
              }
            }
            ::std::__cxx11::string::~string((string *)&local_1e48);
            ::std::__cxx11::string::~string((string *)&local_1e28);
            if (local_2699 == false) {
              fun._M_invoker =
                   (_Invoker_type)
                   Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::Projection,std::__cxx11::string>(std::__cxx11::string_const&)>
              ::
              function<tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCamera>(tinyusdz::Specifier_const&,std::map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>const&,std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>>const&,tinyusdz::GeomCamera*,std::__cxx11::string*,std::__cxx11::string*,tinyusdz::prim::PrimReconstructOptions_const&)::__0&,void>
                        ((function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::Projection,std::__cxx11::string>(std::__cxx11::string_const&)>
                          *)local_2068,
                         (anon_class_1_0_00000001 *)
                         ((long)&table._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)&local_2088,"projection",&local_2089);
              bVar1 = options->strict_allowedToken_check;
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::Projection,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function(&local_20b0,
                         (function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::Projection,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_2068);
              target = (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *
                       )err;
              bVar1 = ParseTimeSampledEnumProperty<tinyusdz::GeomCamera::Projection,tinyusdz::GeomCamera::Projection>
                                (&local_2088,(bool)(bVar1 & 1),&local_20b0,
                                 (Attribute *)fun._M_invoker,&camera->projection,warn,err);
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::Projection,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::~function(&local_20b0);
              ::std::__cxx11::string::~string((string *)&local_2088);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_2089);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                pAVar5 = Attribute::metas((Attribute *)fun._M_invoker);
                pAVar6 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_>
                         ::metas(&camera->projection);
                AttrMetas::operator=(pAVar6,pAVar5);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)local_20d0,"projection",&local_20d1);
                pVar9 = ::std::
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_78,local_20d0);
                local_20e8 = (_Base_ptr)pVar9.first._M_node;
                local_20e0 = pVar9.second;
                ::std::__cxx11::string::~string((string *)local_20d0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_20d1);
                __range2._4_4_ = 3;
              }
              else {
                spec_local._7_1_ = 0;
                __range2._4_4_ = 1;
              }
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::Projection,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::~function((function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::Projection,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           *)local_2068);
              goto joined_r0x002adbe1;
            }
            ::std::__cxx11::ostringstream::ostringstream(local_1fc0);
            poVar8 = ::std::operator<<((ostream *)local_1fc0,"[warn]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"ReconstructPrim");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xf03);
            ::std::operator<<(poVar8," ");
            poVar8 = ::std::operator<<((ostream *)local_1fc0,"No value assigned to `");
            poVar8 = ::std::operator<<(poVar8,"projection");
            poVar8 = ::std::operator<<(poVar8,"` token attribute. Set default token value.");
            ::std::operator<<(poVar8,"\n");
            if (warn != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_1fe0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &attr);
              ::std::__cxx11::string::operator=((string *)warn,(string *)local_1fe0);
              ::std::__cxx11::string::~string((string *)local_1fe0);
              ::std::__cxx11::string::~string((string *)&attr);
            }
            ::std::__cxx11::ostringstream::~ostringstream(local_1fc0);
            local_2008 = Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
            pAVar5 = Attribute::metas(local_2008);
            pAVar6 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_>
                     ::metas(&camera->projection);
            AttrMetas::operator=(pAVar6,pAVar5);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_2028,"projection",&local_2029);
            ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_78,local_2028);
            ::std::__cxx11::string::~string((string *)local_2028);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_2029);
          }
        }
        else {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)ret.err.field_2._8_8_,"stereoRole");
          if (bVar1) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_2108,"stereoRole",&local_2109);
            sVar7 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_78,local_2108);
            ::std::__cxx11::string::~string((string *)local_2108);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_2109);
            if (sVar7 == 0) {
              Property::value_type_name_abi_cxx11_
                        (&local_2130,(Property *)(ret.err.field_2._8_8_ + 0x20));
              tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
              _Var2 = ::std::operator==(&local_2130,&local_2150);
              local_26c1 = false;
              if (_Var2) {
                bVar1 = Property::is_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
                local_26c1 = false;
                if (bVar1) {
                  local_26c1 = Property::is_empty((Property *)(ret.err.field_2._8_8_ + 0x20));
                }
              }
              ::std::__cxx11::string::~string((string *)&local_2150);
              ::std::__cxx11::string::~string((string *)&local_2130);
              if (local_26c1 == false) {
                fun_1._M_invoker =
                     (_Invoker_type)
                     Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::StereoRole,std::__cxx11::string>(std::__cxx11::string_const&)>
                ::
                function<tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCamera>(tinyusdz::Specifier_const&,std::map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>const&,std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>>const&,tinyusdz::GeomCamera*,std::__cxx11::string*,std::__cxx11::string*,tinyusdz::prim::PrimReconstructOptions_const&)::__1&,void>
                          ((function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::StereoRole,std::__cxx11::string>(std::__cxx11::string_const&)>
                            *)local_2368,
                           (anon_class_1_0_00000001 *)
                           ((long)&table._M_t._M_impl.super__Rb_tree_header._M_node_count + 6));
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)&local_2388,"stereoRole",&local_2389);
                bVar1 = options->strict_allowedToken_check;
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::StereoRole,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::function(&local_23b0,
                           (function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::StereoRole,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)local_2368);
                target = (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                          *)err;
                bVar1 = ParseUniformEnumProperty<tinyusdz::GeomCamera::StereoRole,tinyusdz::GeomCamera::StereoRole>
                                  (&local_2388,(bool)(bVar1 & 1),&local_23b0,
                                   (Attribute *)fun_1._M_invoker,&camera->stereoRole,warn,err);
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::StereoRole,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::~function(&local_23b0);
                ::std::__cxx11::string::~string((string *)&local_2388);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_2389);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  pAVar5 = Attribute::metas((Attribute *)fun_1._M_invoker);
                  pAVar6 = TypedAttributeWithFallback<tinyusdz::GeomCamera::StereoRole>::metas
                                     (&camera->stereoRole);
                  AttrMetas::operator=(pAVar6,pAVar5);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string((string *)local_23d0,"stereoRole",&local_23d1);
                  ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_78,local_23d0);
                  ::std::__cxx11::string::~string((string *)local_23d0);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_23d1);
                  __range2._4_4_ = 3;
                }
                else {
                  spec_local._7_1_ = 0;
                  __range2._4_4_ = 1;
                }
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::StereoRole,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::~function((function<nonstd::expected_lite::expected<tinyusdz::GeomCamera::StereoRole,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             *)local_2368);
                goto joined_r0x002adbe1;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_22c8);
              poVar8 = ::std::operator<<((ostream *)local_22c8,"[warn]");
              poVar8 = ::std::operator<<(poVar8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar8 = ::std::operator<<(poVar8,":");
              poVar8 = ::std::operator<<(poVar8,"ReconstructPrim");
              poVar8 = ::std::operator<<(poVar8,"():");
              poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xf05);
              ::std::operator<<(poVar8," ");
              poVar8 = ::std::operator<<((ostream *)local_22c8,"No value assigned to `");
              poVar8 = ::std::operator<<(poVar8,"stereoRole");
              poVar8 = ::std::operator<<(poVar8,"` token attribute. Set default token value.");
              ::std::operator<<(poVar8,"\n");
              if (warn != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_22e8,local_2308);
                ::std::__cxx11::string::operator=((string *)warn,(string *)local_22e8);
                ::std::__cxx11::string::~string((string *)local_22e8);
                ::std::__cxx11::string::~string((string *)local_2308);
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_22c8);
              this = Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
              pAVar5 = Attribute::metas(this);
              pAVar6 = TypedAttributeWithFallback<tinyusdz::GeomCamera::StereoRole>::metas
                                 (&camera->stereoRole);
              AttrMetas::operator=(pAVar6,pAVar5);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)local_2328,"stereoRole",&local_2329);
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_78,local_2328);
              ::std::__cxx11::string::~string((string *)local_2328);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_2329);
            }
          }
          else {
            sVar7 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_78,(key_type *)ret.err.field_2._8_8_);
            if (sVar7 == 0) {
              pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
              this_00 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        ::operator[](&(camera->super_GPrim).props,(key_type *)ret.err.field_2._8_8_)
              ;
              Property::operator=(this_00,pPVar3);
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_78,(value_type_conflict *)ret.err.field_2._8_8_);
            }
            sVar7 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_78,(key_type *)ret.err.field_2._8_8_);
            if (sVar7 == 0) {
              ::std::__cxx11::ostringstream::ostringstream(local_2570);
              poVar8 = ::std::operator<<((ostream *)local_2570,"[error]");
              poVar8 = ::std::operator<<(poVar8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar8 = ::std::operator<<(poVar8,":");
              poVar8 = ::std::operator<<(poVar8,"ReconstructPrim");
              poVar8 = ::std::operator<<(poVar8,"():");
              poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xf07);
              ::std::operator<<(poVar8," ");
              ::std::operator+(&local_2590,"Unsupported/unimplemented property: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ret.err.field_2._8_8_);
              poVar8 = ::std::operator<<((ostream *)local_2570,(string *)&local_2590);
              ::std::operator<<(poVar8,"\n");
              ::std::__cxx11::string::~string((string *)&local_2590);
              if (err != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_25b0,local_25d0);
                ::std::__cxx11::string::operator=((string *)err,(string *)local_25b0);
                ::std::__cxx11::string::~string((string *)local_25b0);
                ::std::__cxx11::string::~string((string *)local_25d0);
              }
              spec_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_2570);
              goto LAB_002ae259;
            }
          }
        }
      }
      else {
joined_r0x002adbe1:
        if (__range2._4_4_ != 3) goto LAB_002ae259;
      }
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
      ::operator++(&__end2);
    }
    spec_local._7_1_ = 1;
  }
  else {
    spec_local._7_1_ = 0;
  }
LAB_002ae259:
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_78);
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructPrim<GeomCamera>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomCamera *camera,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  (void)references;
  (void)warn;
  (void)options;

  auto ProjectionHandler = [](const std::string &tok)
      -> nonstd::expected<GeomCamera::Projection, std::string> {
    using EnumTy = std::pair<GeomCamera::Projection, const char *>;
    constexpr std::array<EnumTy, 2> enums = {
        std::make_pair(GeomCamera::Projection::Perspective, "perspective"),
        std::make_pair(GeomCamera::Projection::Orthographic, "orthographic"),
    };

    auto ret =
        CheckAllowedTokens<GeomCamera::Projection, enums.size()>(enums, tok);
    if (!ret) {
      return nonstd::make_unexpected(ret.error());
    }

    for (auto &item : enums) {
      if (tok == item.second) {
        return item.first;
      }
    }

    // Should never reach here, though.
    return nonstd::make_unexpected(
        quote(tok) + " is invalid token for `projection` propety");
  };

  auto StereoRoleHandler = [](const std::string &tok)
      -> nonstd::expected<GeomCamera::StereoRole, std::string> {
    using EnumTy = std::pair<GeomCamera::StereoRole, const char *>;
    constexpr std::array<EnumTy, 3> enums = {
        std::make_pair(GeomCamera::StereoRole::Mono, "mono"),
        std::make_pair(GeomCamera::StereoRole::Left, "left"),
        std::make_pair(GeomCamera::StereoRole::Right, "right"),
    };

    auto ret =
        CheckAllowedTokens<GeomCamera::StereoRole, enums.size()>(enums, tok);
    if (!ret) {
      return nonstd::make_unexpected(ret.error());
    }

    for (auto &item : enums) {
      if (tok == item.second) {
        return item.first;
      }
    }

    // Should never reach here, though.
    return nonstd::make_unexpected(
        quote(tok) + " is invalid token for `stereoRole` propety");
  };

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, camera, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "focalLength", GeomCamera, camera->focalLength)
    PARSE_TYPED_ATTRIBUTE(table, prop, "focusDistance", GeomCamera,
                   camera->focusDistance)
    PARSE_TYPED_ATTRIBUTE(table, prop, "exposure", GeomCamera, camera->exposure)
    PARSE_TYPED_ATTRIBUTE(table, prop, "fStop", GeomCamera, camera->fStop)
    PARSE_TYPED_ATTRIBUTE(table, prop, "horizontalAperture", GeomCamera,
                   camera->horizontalAperture)
    PARSE_TYPED_ATTRIBUTE(table, prop, "horizontalApertureOffset", GeomCamera,
                   camera->horizontalApertureOffset)
    PARSE_TYPED_ATTRIBUTE(table, prop, "verticalAperture", GeomCamera,
                   camera->verticalAperture)
    PARSE_TYPED_ATTRIBUTE(table, prop, "verticalApertureOffset", GeomCamera,
                   camera->verticalApertureOffset)
    PARSE_TYPED_ATTRIBUTE(table, prop, "clippingRange", GeomCamera,
                   camera->clippingRange)
    PARSE_TYPED_ATTRIBUTE(table, prop, "clippingPlanes", GeomCamera,
                   camera->clippingPlanes)
    PARSE_TYPED_ATTRIBUTE(table, prop, "shutter:open", GeomCamera, camera->shutterOpen)
    PARSE_TYPED_ATTRIBUTE(table, prop, "shutter:close", GeomCamera,
                   camera->shutterClose)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "projection", GeomCamera::Projection, ProjectionHandler, GeomCamera,
                       camera->projection, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "stereoRole", GeomCamera::StereoRole, StereoRoleHandler, GeomCamera,
                       camera->stereoRole, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, GeomCamera, camera->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}